

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

string * __thiscall
cs_impl::to_string_if<std::shared_ptr<cs::name_space>,false>::to_string_abi_cxx11_
          (string *__return_storage_ptr__,to_string_if<std::shared_ptr<cs::name_space>,false> *this,
          shared_ptr<cs::name_space> *param_1)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  string local_30;
  
  cxx_demangle_abi_cxx11_(&local_30,(cs_impl *)"cs::namespace",(char *)param_1);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_30,0,(char *)0x0,0x2c14ad);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_40 = *plVar3;
    lStack_38 = plVar2[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar3;
    local_50 = (long *)*plVar2;
  }
  local_48 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string to_string(const T &)
		{
			return "[" + cxx_demangle(get_name_of_type<T>()) + "]";
		}